

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSResolveResultEnum
js_resolve_export1(JSContext *ctx,JSModuleDef **pmodule,JSExportEntry **pme,JSModuleDef *m,
                  JSAtom export_name,JSResolveState *s)

{
  JSResolveEntry *pJVar1;
  int iVar2;
  JSResolveResultEnum JVar3;
  ulong uVar4;
  JSExportEntry *pJVar5;
  long lVar6;
  JSAtomStruct *extraout_RDX;
  JSAtomStruct *pJVar7;
  int i;
  uint uVar8;
  JSAtom export_name_00;
  JSModuleDef *m_00;
  JSExportEntry *local_48;
  JSModuleDef *local_40;
  int *local_38;
  
  m_00 = (JSModuleDef *)(ulong)export_name;
  local_38 = &s->size;
  uVar8 = s->count;
  while( true ) {
    *pmodule = (JSModuleDef *)0x0;
    *pme = (JSExportEntry *)0x0;
    uVar4 = 0;
    if (0 < (int)uVar8) {
      uVar4 = (ulong)uVar8;
    }
    for (lVar6 = 0; export_name_00 = (JSAtom)m_00, uVar4 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
      if ((*(JSContext **)((long)&s->array->module + lVar6) == (JSContext *)m) &&
         (*(JSAtom *)((long)&s->array->name + lVar6) == export_name_00)) {
        return JS_RESOLVE_RES_CIRCULAR;
      }
    }
    iVar2 = js_resize_array(ctx,&s->array,0x10,local_38,uVar8 + 1);
    if (iVar2 != 0) {
      return JS_RESOLVE_RES_EXCEPTION;
    }
    pJVar1 = s->array;
    iVar2 = s->count;
    uVar8 = iVar2 + 1;
    s->count = uVar8;
    pJVar1[iVar2].module = m;
    pJVar7 = extraout_RDX;
    if (0xd1 < (int)export_name_00) {
      pJVar7 = ctx->rt->atom_array[(long)m_00];
      (pJVar7->header).ref_count = (pJVar7->header).ref_count + 1;
    }
    pJVar1[iVar2].name = export_name_00;
    pJVar5 = find_export_entry((JSContext *)m,m_00,(JSAtom)pJVar7);
    if (pJVar5 == (JSExportEntry *)0x0) break;
    if ((pJVar5->export_type == JS_EXPORT_TYPE_LOCAL) ||
       (m_00 = (JSModuleDef *)(ulong)pJVar5->local_name, pJVar5->local_name == 0x7d)) {
      *pmodule = m;
      *pme = pJVar5;
      return JS_RESOLVE_RES_FOUND;
    }
    m = (JSModuleDef *)(&(((JSContext *)m)->rt->mf).js_free)[(long)(pJVar5->u).local.var_idx * 2];
  }
  if (export_name_00 != 0x16) {
    for (lVar6 = 0; lVar6 < *(int *)&((JSContext *)m)->class_proto; lVar6 = lVar6 + 1) {
      JVar3 = js_resolve_export1(ctx,&local_40,&local_48,
                                 (JSModuleDef *)
                                 (&(((JSContext *)m)->rt->mf).js_free)
                                 [(long)(&(((JSContext *)m)->array_shape->header).ref_count)[lVar6]
                                  * 2],export_name_00,s);
      if (JVar3 == JS_RESOLVE_RES_FOUND) {
        if (*pme == (JSExportEntry *)0x0) {
          *pmodule = local_40;
          *pme = local_48;
        }
        else if ((*pmodule != local_40) || (local_48->local_name != (*pme)->local_name)) {
          *pmodule = (JSModuleDef *)0x0;
          *pme = (JSExportEntry *)0x0;
          return JS_RESOLVE_RES_AMBIGUOUS;
        }
      }
      else {
        if (JVar3 == JS_RESOLVE_RES_EXCEPTION) {
          return JS_RESOLVE_RES_EXCEPTION;
        }
        if (JVar3 == JS_RESOLVE_RES_AMBIGUOUS) {
          return JS_RESOLVE_RES_AMBIGUOUS;
        }
      }
    }
    if (*pme != (JSExportEntry *)0x0) {
      return JS_RESOLVE_RES_FOUND;
    }
  }
  return JS_RESOLVE_RES_NOT_FOUND;
}

Assistant:

static JSResolveResultEnum js_resolve_export1(JSContext *ctx,
                                              JSModuleDef **pmodule,
                                              JSExportEntry **pme,
                                              JSModuleDef *m,
                                              JSAtom export_name,
                                              JSResolveState *s)
{
    JSExportEntry *me;

    *pmodule = NULL;
    *pme = NULL;
    if (find_resolve_entry(s, m, export_name) >= 0)
        return JS_RESOLVE_RES_CIRCULAR;
    if (add_resolve_entry(ctx, s, m, export_name) < 0)
        return JS_RESOLVE_RES_EXCEPTION;
    me = find_export_entry(ctx, m, export_name);
    if (me) {
        if (me->export_type == JS_EXPORT_TYPE_LOCAL) {
            /* local export */
            *pmodule = m;
            *pme = me;
            return JS_RESOLVE_RES_FOUND;
        } else {
            /* indirect export */
            JSModuleDef *m1;
            m1 = m->req_module_entries[me->u.req_module_idx].module;
            if (me->local_name == JS_ATOM__star_) {
                /* export ns from */
                *pmodule = m;
                *pme = me;
                return JS_RESOLVE_RES_FOUND;
            } else {
                return js_resolve_export1(ctx, pmodule, pme, m1,
                                          me->local_name, s);
            }
        }
    } else {
        if (export_name != JS_ATOM_default) {
            /* not found in direct or indirect exports: try star exports */
            int i;

            for(i = 0; i < m->star_export_entries_count; i++) {
                JSStarExportEntry *se = &m->star_export_entries[i];
                JSModuleDef *m1, *res_m;
                JSExportEntry *res_me;
                JSResolveResultEnum ret;

                m1 = m->req_module_entries[se->req_module_idx].module;
                ret = js_resolve_export1(ctx, &res_m, &res_me, m1,
                                         export_name, s);
                if (ret == JS_RESOLVE_RES_AMBIGUOUS ||
                    ret == JS_RESOLVE_RES_EXCEPTION) {
                    return ret;
                } else if (ret == JS_RESOLVE_RES_FOUND) {
                    if (*pme != NULL) {
                        if (*pmodule != res_m ||
                            res_me->local_name != (*pme)->local_name) {
                            *pmodule = NULL;
                            *pme = NULL;
                            return JS_RESOLVE_RES_AMBIGUOUS;
                        }
                    } else {
                        *pmodule = res_m;
                        *pme = res_me;
                    }
                }
            }
            if (*pme != NULL)
                return JS_RESOLVE_RES_FOUND;
        }
        return JS_RESOLVE_RES_NOT_FOUND;
    }
}